

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O1

ShmDataBuffer * __thiscall adios2::aggregator::MPIShmChain::LockConsumerBuffer(MPIShmChain *this)

{
  ShmDataBuffer *pSVar1;
  int iVar2;
  int *piVar3;
  ShmSegment *pSVar4;
  ShmDataBuffer *pSVar5;
  bool bVar6;
  timespec local_20;
  
  pSVar4 = this->m_Shm;
  if (pSVar4->NumBuffersFull == 0) {
    do {
      local_20.tv_sec = 0;
      local_20.tv_nsec = 10000;
      do {
        iVar2 = nanosleep(&local_20,&local_20);
        if (iVar2 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      pSVar4 = this->m_Shm;
    } while (pSVar4->NumBuffersFull == 0);
  }
  shm::Spinlock::lock(&pSVar4->lockSegment);
  pSVar4 = this->m_Shm;
  pSVar1 = &pSVar4->sdbB;
  if (pSVar4->consumerBuffer != A) {
    pSVar1 = &pSVar4->sdbA;
  }
  bVar6 = pSVar4->consumerBuffer == A;
  pSVar5 = &pSVar4->sdbA;
  if (bVar6) {
    pSVar5 = &pSVar4->sdbB;
  }
  pSVar4->consumerBuffer = bVar6 + A;
  pSVar1->buf = (&this->m_ShmBufA)[bVar6];
  shm::Spinlock::unlock(&pSVar4->lockSegment);
  shm::Spinlock::lock(&this->m_Shm->lockA + (this->m_Shm->consumerBuffer != A));
  return pSVar5;
}

Assistant:

MPIShmChain::ShmDataBuffer *MPIShmChain::LockConsumerBuffer()
{
    MPIShmChain::ShmDataBuffer *sdb = nullptr;

    // Sleep until there is at least one buffer filled
    while (m_Shm->NumBuffersFull < 1)
    {
        std::this_thread::sleep_for(std::chrono::duration<double>(0.00001));
    }
    // At this point we know buffer A has content or going to have content
    // when we successfully lock it

    m_Shm->lockSegment.lock();
    if (m_Shm->consumerBuffer == LastBufferUsed::A)

    {
        m_Shm->consumerBuffer = LastBufferUsed::B;
        sdb = &m_Shm->sdbB;
        // point to shm data buffer (in local process memory)
        sdb->buf = m_ShmBufB;
    }
    else // None or B
    {
        m_Shm->consumerBuffer = LastBufferUsed::A;
        sdb = &m_Shm->sdbA;
        // point to shm data buffer (in local process memory)
        sdb->buf = m_ShmBufA;
    }
    m_Shm->lockSegment.unlock();

    // We determined we want a specific buffer
    // Now we need to get a lock on it in case producer is using it
    if (m_Shm->consumerBuffer == LastBufferUsed::A)
    {
        m_Shm->lockA.lock();
    }
    else
    {
        m_Shm->lockB.lock();
    }

    return sdb;
}